

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>_>
::release(Entry *__return_storage_ptr__,
         Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>_>
         *this,Entry *row)

{
  size_t oldPos;
  Entry *pEVar1;
  RemoveConst<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry>
  *pRVar2;
  PromiseFulfiller<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pPVar3;
  Disposer *pDVar4;
  size_t pos;
  HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
  *indexObj;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry>
  table;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry>
  table_00;
  PromiseFulfiller<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *ptrCopy;
  
  pEVar1 = (this->rows).builder.ptr;
  pos = ((long)row - (long)pEVar1 >> 3) * -0x3333333333333333;
  table.size_ = ((long)(this->rows).builder.pos - (long)pEVar1 >> 3) * -0x3333333333333333;
  table.ptr = pEVar1;
  HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
  ::
  erase<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry,unsigned_int&>
            ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
              *)&this->indexes,table,pos,&row->key);
  __return_storage_ptr__->key = row->key;
  (__return_storage_ptr__->value).importClient.ptr = (row->value).importClient.ptr;
  (row->value).importClient.ptr = (ImportClient *)0x0;
  (__return_storage_ptr__->value).appClient.ptr = (row->value).appClient.ptr;
  (row->value).appClient.ptr = (RpcClient *)0x0;
  (__return_storage_ptr__->value).promiseFulfiller.ptr.disposer =
       (row->value).promiseFulfiller.ptr.disposer;
  (__return_storage_ptr__->value).promiseFulfiller.ptr.ptr = (row->value).promiseFulfiller.ptr.ptr;
  (row->value).promiseFulfiller.ptr.ptr =
       (PromiseFulfiller<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
  pEVar1 = (this->rows).builder.ptr;
  table_00.size_ = ((long)(this->rows).builder.pos - (long)pEVar1 >> 3) * -0x3333333333333333;
  oldPos = table_00.size_ - 1;
  if (pos - oldPos != 0) {
    table_00.ptr = pEVar1;
    HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
    ::
    move<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Entry,unsigned_int&>
              ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::Callbacks>
                *)&this->indexes,table_00,oldPos,pos,&pEVar1[oldPos].key);
    pEVar1 = (this->rows).builder.ptr + oldPos;
    row->key = pEVar1->key;
    capnp::_::RpcSystemBase::RpcConnectionState::Import::operator=(&row->value,&pEVar1->value);
  }
  pRVar2 = (this->rows).builder.pos;
  (this->rows).builder.pos = pRVar2 + -1;
  pPVar3 = pRVar2[-1].value.promiseFulfiller.ptr.ptr;
  if (pPVar3 != (PromiseFulfiller<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    pRVar2[-1].value.promiseFulfiller.ptr.ptr =
         (PromiseFulfiller<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    pDVar4 = pRVar2[-1].value.promiseFulfiller.ptr.disposer;
    (**pDVar4->_vptr_Disposer)
              (pDVar4,(pPVar3->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar3->super_PromiseRejector)._vptr_PromiseRejector);
  }
  return __return_storage_ptr__;
}

Assistant:

Row Table<Row, Indexes...>::release(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  size_t pos = &row - rows.begin();
  Impl<>::erase(*this, pos, row);
  Row result = kj::mv(row);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    row = kj::mv(rows[back]);
  }
  rows.removeLast();
  return result;
}